

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O3

void __thiscall
Utf8Decode_IllegalCodePositions_Test::TestBody(Utf8Decode_IllegalCodePositions_Test *this)

{
  allocator_type *paVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  initializer_list<unsigned_char> __l_12;
  initializer_list<unsigned_char> __l_13;
  allocator_type local_209;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_208;
  undefined4 local_1f0;
  undefined2 local_1ec;
  cpstring local_1e8;
  cpstring local_1c8;
  cpstring local_1a8;
  cpstring local_188;
  cpstring local_168;
  cpstring local_148;
  cpstring local_128;
  cpstring local_108;
  cpstring local_e8;
  cpstring local_c8;
  cpstring local_a8;
  cpstring local_88;
  cpstring local_68;
  cpstring local_48;
  cpstring local_28;
  
  local_1f0 = CONCAT13(local_1f0._3_1_,0x80a0ed);
  paVar1 = &local_209;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_28,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = CONCAT13(local_1f0._3_1_,0xbfaded);
  paVar1 = &local_209;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_00,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_48,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = CONCAT13(local_1f0._3_1_,0x80aeed);
  paVar1 = &local_209;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_01,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_68,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = CONCAT13(local_1f0._3_1_,0xbfafed);
  paVar1 = &local_209;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_02,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_88,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = CONCAT13(local_1f0._3_1_,0x80b0ed);
  paVar1 = &local_209;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_03,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_a8,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = CONCAT13(local_1f0._3_1_,0x80beed);
  paVar1 = &local_209;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_04,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_c8,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = CONCAT13(local_1f0._3_1_,0xbfbfed);
  paVar1 = &local_209;
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_05,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_e8,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = 0xed80a0ed;
  local_1ec = 0x80b0;
  paVar1 = &local_209;
  __l_06._M_len = 6;
  __l_06._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_06,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_108,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = 0xed80a0ed;
  local_1ec = 0xbfbf;
  paVar1 = &local_209;
  __l_07._M_len = 6;
  __l_07._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_07,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_128,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = 0xedbfaded;
  local_1ec = 0x80b0;
  paVar1 = &local_209;
  __l_08._M_len = 6;
  __l_08._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_08,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_148,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = 0xedbfaded;
  local_1ec = 0xbfbf;
  paVar1 = &local_209;
  __l_09._M_len = 6;
  __l_09._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_09,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_168,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = 0xed80aeed;
  local_1ec = 0x80b0;
  paVar1 = &local_209;
  __l_10._M_len = 6;
  __l_10._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_10,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_188,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = 0xed80aeed;
  local_1ec = 0xbfbf;
  paVar1 = &local_209;
  __l_11._M_len = 6;
  __l_11._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_11,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_1a8,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = 0xedbfafed;
  local_1ec = 0x80b0;
  paVar1 = &local_209;
  __l_12._M_len = 6;
  __l_12._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_12,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_1c8,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = 0xedbfafed;
  local_1ec = 0xbfbf;
  paVar1 = &local_209;
  __l_13._M_len = 6;
  __l_13._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_208,__l_13,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_1e8,&local_208,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F (Utf8Decode, IllegalCodePositions) {
    // Single UTF-16 surrogates
    decode_bad (bytes ({0xED, 0xA0, 0x80})); // U+D800
    decode_bad (bytes ({0xED, 0xAD, 0xBF})); // U+DB7F
    decode_bad (bytes ({0xED, 0xAE, 0x80})); // U+DB80
    decode_bad (bytes ({0xED, 0xAF, 0xBF})); // U+DBFF
    decode_bad (bytes ({0xED, 0xB0, 0x80})); // U+DC00
    decode_bad (bytes ({0xED, 0xBE, 0x80})); // U+DF80
    decode_bad (bytes ({0xED, 0xBF, 0xBF})); // U+DFFF

    // Paired UTF-16 surrogates
    decode_bad (bytes ({0xED, 0xA0, 0x80, 0xED, 0xB0, 0x80})); // U+D800 U+DC00
    decode_bad (bytes ({0xED, 0xA0, 0x80, 0xED, 0xBF, 0xBF})); // U+D800 U+DFFF
    decode_bad (bytes ({0xED, 0xAD, 0xBF, 0xED, 0xB0, 0x80})); // U+DB7F U+DC00
    decode_bad (bytes ({0xED, 0xAD, 0xBF, 0xED, 0xBF, 0xBF})); // U+DB7F U+DFFF
    decode_bad (bytes ({0xED, 0xAE, 0x80, 0xED, 0xB0, 0x80})); // U+DB80 U+DC00
    decode_bad (bytes ({0xED, 0xAE, 0x80, 0xED, 0xBF, 0xBF})); // U+DB80 U+DFFF
    decode_bad (bytes ({0xED, 0xAF, 0xBF, 0xED, 0xB0, 0x80})); // U+DBFF U+DC00
    decode_bad (bytes ({0xED, 0xAF, 0xBF, 0xED, 0xBF, 0xBF})); // U+DBFF U+DFFF
}